

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_sync.cpp
# Opt level: O0

void __thiscall
DSDcc::DSDSync::matchSome
          (DSDSync *this,uchar *start,int maxHistory,SyncPattern *patterns,int nbPatterns)

{
  char cVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  uint *in_RDI;
  int in_R8D;
  int p;
  int ip;
  uchar c;
  int i;
  int pshift;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_30;
  
  std::fill<unsigned_int*,int>
            ((uint *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
             (int *)0x123f0e);
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    cVar1 = *(char *)(in_RSI + local_30);
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
      iVar2 = *(int *)(in_RCX + (long)local_38 * 4);
      if (((in_RDI[iVar2] <= *(uint *)(m_syncLenTol + (long)iVar2 * 8 + 4)) &&
          (m_syncPatterns[(long)(local_30 + (0x20 - in_EDX)) + (long)iVar2 * 0x20] != '\0')) &&
         (cVar1 != m_syncPatterns[(long)(local_30 + (0x20 - in_EDX)) + (long)iVar2 * 0x20])) {
        in_RDI[iVar2] = in_RDI[iVar2] + 1;
      }
    }
  }
  return;
}

Assistant:

void DSDSync::matchSome(const unsigned char *start, int maxHistory, const SyncPattern *patterns, int nbPatterns)
{
    std::fill(m_syncErrors, m_syncErrors + m_patterns, 0);
    int pshift = m_history - maxHistory;

    for (int i = 0; i < maxHistory; i++)
    {
        unsigned char c = start[i];

        for (int ip = 0; ip < nbPatterns; ip++)
        {
            int p = (int) patterns[ip];

            if (m_syncErrors[p] > m_syncLenTol[p][1]) {
                continue;
            }
            if ((m_syncPatterns[p][i+pshift] != 0) && (c != m_syncPatterns[p][i+pshift])) {
                m_syncErrors[p]++;
            }
        }
    }
}